

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99ZiVal(stb99_seed *seed)

{
  size_t i;
  stb99_seed *seed_local;
  
  i = 0;
  while( true ) {
    if (0x1e < i) {
      return 0;
    }
    if ((seed->zi[i] == 0) || (0xfee8 < seed->zi[i])) break;
    i = i + 1;
  }
  return 0x20c;
}

Assistant:

static err_t stb99ZiVal(const stb99_seed* seed)
{
	size_t i;
	for (i = 0; i < 31; ++i)
		if (seed->zi[i] == 0 || seed->zi[i] >= 65257)
			return ERR_BAD_SEED;
	return ERR_OK;
}